

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,block_statement *s)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  completion local_70;
  
  bVar1 = this->strict_mode_;
  if (bVar1 == true && s->strict_mode_ == false) {
    __assert_fail("!i.strict_mode_ || next_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x508,
                  "mjs::interpreter::impl::strict_mode_scope::strict_mode_scope(impl &, bool)");
  }
  this->strict_mode_ = s->strict_mode_;
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  puVar2 = (s->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (s->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    do {
      puVar4 = puVar2 + 1;
      eval(&local_70,this,
           (puVar2->_M_t).
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
      __return_storage_ptr__->type = local_70.type;
      value::operator=(&__return_storage_ptr__->result,&local_70.result);
      (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
      (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
      value::destroy(&local_70.result);
      if (__return_storage_ptr__->type != normal) break;
      puVar2 = puVar4;
    } while (puVar4 != puVar3);
  }
  this->strict_mode_ = bVar1;
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const block_statement& s) {
        strict_mode_scope sms{*this, s.strict_mode()};
        completion c{};
        for (const auto& bs: s.l()) {
            c = eval(*bs);
            if (c) break;
        }
        return c;
    }